

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eckey_impl.h
# Opt level: O0

int secp256k1_eckey_pubkey_serialize(secp256k1_ge *elem,uchar *pub,size_t *size,int compressed)

{
  undefined1 uVar1;
  int iVar2;
  int in_ECX;
  uchar *in_RDX;
  undefined1 *in_RSI;
  uint in_stack_ffffffffffffffd8;
  undefined4 local_4;
  
  iVar2 = secp256k1_ge_is_infinity((secp256k1_ge *)0x102321);
  if (iVar2 == 0) {
    secp256k1_fe_normalize_var((secp256k1_fe *)0x10233d);
    secp256k1_fe_normalize_var((secp256k1_fe *)0x10234b);
    secp256k1_fe_get_b32(in_RDX,(secp256k1_fe *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8));
    if (in_ECX == 0) {
      in_RDX[0] = 'A';
      in_RDX[1] = '\0';
      in_RDX[2] = '\0';
      in_RDX[3] = '\0';
      in_RDX[4] = '\0';
      in_RDX[5] = '\0';
      in_RDX[6] = '\0';
      in_RDX[7] = '\0';
      *in_RSI = 4;
      secp256k1_fe_get_b32(in_RDX,(secp256k1_fe *)(ulong)in_stack_ffffffffffffffd8);
    }
    else {
      in_RDX[0] = '!';
      in_RDX[1] = '\0';
      in_RDX[2] = '\0';
      in_RDX[3] = '\0';
      in_RDX[4] = '\0';
      in_RDX[5] = '\0';
      in_RDX[6] = '\0';
      in_RDX[7] = '\0';
      iVar2 = secp256k1_fe_is_odd((secp256k1_fe *)0x10237f);
      uVar1 = 2;
      if (iVar2 != 0) {
        uVar1 = 3;
      }
      *in_RSI = uVar1;
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int secp256k1_eckey_pubkey_serialize(secp256k1_ge *elem, unsigned char *pub, size_t *size, int compressed) {
    if (secp256k1_ge_is_infinity(elem)) {
        return 0;
    }
    secp256k1_fe_normalize_var(&elem->x);
    secp256k1_fe_normalize_var(&elem->y);
    secp256k1_fe_get_b32(&pub[1], &elem->x);
    if (compressed) {
        *size = 33;
        pub[0] = secp256k1_fe_is_odd(&elem->y) ? SECP256K1_TAG_PUBKEY_ODD : SECP256K1_TAG_PUBKEY_EVEN;
    } else {
        *size = 65;
        pub[0] = SECP256K1_TAG_PUBKEY_UNCOMPRESSED;
        secp256k1_fe_get_b32(&pub[33], &elem->y);
    }
    return 1;
}